

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O0

QPainterPath __thiscall QRawFont::pathForGlyph(QRawFont *this,quint32 glyphIndex)

{
  bool bVar1;
  QRawFontPrivate *pQVar2;
  QExplicitlySharedDataPointer<QPainterPathPrivate> in_RDI;
  long in_FS_OFFSET;
  QPainterPath *path;
  QFixedPoint position;
  QFixedPoint *in_stack_ffffffffffffffb0;
  QFontEngine *pQVar3;
  uint local_18;
  undefined1 *local_14;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x790a60);
  bVar1 = QRawFontPrivate::isValid(pQVar2);
  if (bVar1) {
    local_14 = &DAT_aaaaaaaaaaaaaaaa;
    QFixedPoint::QFixedPoint(in_stack_ffffffffffffffb0);
    *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)0x790aaa);
    pQVar2 = QExplicitlySharedDataPointer<QRawFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QRawFontPrivate> *)0x790ab4);
    pQVar3 = pQVar2->fontEngine;
    memset(&local_18,0,4);
    QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x790ad7);
    (*pQVar3->_vptr_QFontEngine[0xf])(pQVar3,local_c,&local_14,1,in_RDI.d.ptr,(ulong)local_18);
  }
  else {
    QPainterPath::QPainterPath((QPainterPath *)0x790a76);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)in_RDI.d.ptr;
}

Assistant:

QPainterPath QRawFont::pathForGlyph(quint32 glyphIndex) const
{
    if (!d->isValid())
        return QPainterPath();

    QFixedPoint position;
    QPainterPath path;
    d->fontEngine->addGlyphsToPath(&glyphIndex, &position, 1, &path, { });
    return path;
}